

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v6::format_system_error(v6 *this,buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  string_view message_00;
  bool bVar2;
  int iVar3;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *handler;
  undefined4 in_register_00000014;
  buffer<char> *c;
  basic_string_view<char> format_str;
  char *system_message;
  char *local_300;
  char *local_2f8;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_2f0;
  char *local_2e8;
  undefined **local_2d0 [2];
  undefined8 local_2c0;
  undefined8 local_2b8;
  v6 *local_2b0;
  undefined1 local_2a8 [8];
  char *local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined ***local_288;
  undefined8 local_280;
  char **local_278;
  undefined8 local_270;
  undefined4 local_268;
  undefined4 local_258;
  undefined **local_248;
  char *local_240;
  size_t sStack_238;
  ulong local_230;
  char local_228 [504];
  
  handler = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             *)message.data_;
  local_240 = local_228;
  local_248 = &PTR_grow_00114af8;
  local_230 = 500;
  sStack_238 = 500;
  do {
    local_300 = local_240;
    iVar3 = detail::safe_strerror((int)out,&local_300,sStack_238);
    if (iVar3 == 0x22) {
      uVar1 = sStack_238 * 2;
      if (local_230 < uVar1) {
        (*(code *)*local_248)(&local_248,uVar1);
      }
      iVar3 = 0;
      bVar2 = true;
      sStack_238 = uVar1;
    }
    else {
      if (iVar3 == 0) {
        local_2e8 = local_300;
        local_2c0 = *(undefined8 *)(this + 0x10);
        local_2d0[0] = &PTR_grow_00114c68;
        local_2a0 = "{}: {}";
        local_298 = 6;
        local_290 = 0;
        local_288 = local_2d0;
        local_280 = 0xcd;
        local_278 = &local_2f8;
        local_270 = 0;
        local_268 = 0;
        local_258 = 0;
        format_str.size_ = (size_t)local_2a8;
        format_str.data_ = (char *)0x6;
        local_2f8 = (char *)CONCAT44(in_register_00000014,error_code);
        local_2f0 = handler;
        local_2b8 = local_2c0;
        local_2b0 = this;
        detail::
        parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
                  ((detail *)"{}: {}",format_str,handler);
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      bVar2 = false;
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    bVar2 = true;
  }
  local_248 = &PTR_grow_00114af8;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  if (bVar2) {
    message_00.size_ = (size_t)handler;
    message_00.data_ = (char *)CONCAT44(in_register_00000014,error_code);
    detail::format_error_code((buffer<char> *)this,(int)out,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(std::back_inserter(out), "{}: {}", message, system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }